

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsDisableRuntimeExecution(JsRuntimeHandle runtimeHandle)

{
  ThreadContext *this;
  bool bVar1;
  JsErrorCode JVar2;
  JsrtRuntime *runtime;
  
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    return JsErrorInvalidArgument;
  }
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  this = *runtimeHandle;
  bVar1 = ThreadContext::TestThreadContextFlag(this,ThreadContextFlagCanDisableExecution);
  JVar2 = JsErrorCannotDisableExecution;
  if (bVar1) {
    if ((this->recycler != (Recycler *)0x0) &&
       (bVar1 = Memory::Recycler::IsHeapEnumInProgress(this->recycler), bVar1)) {
      return JsErrorHeapEnumInProgress;
    }
    JVar2 = JsErrorInThreadServiceCallback;
    if ((this->threadService).isInCallback == false) {
      ThreadContext::DisableExecution(this);
      JVar2 = JsNoError;
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsDisableRuntimeExecution(_In_ JsRuntimeHandle runtimeHandle)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

    ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    if (!threadContext->TestThreadContextFlag(ThreadContextFlagCanDisableExecution))
    {
        return JsErrorCannotDisableExecution;
    }

    if (threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    threadContext->DisableExecution();
    return JsNoError;
}